

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O3

void __thiscall
winmd::reader::MethodDefSig::MethodDefSig(MethodDefSig *this,table_base *table,byte_view *data)

{
  byte bVar1;
  CallingConvention CVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  string local_58;
  table_base *local_38;
  
  local_38 = table;
  CVar2 = uncompress_enum<winmd::reader::CallingConvention>(data);
  this->m_calling_convention = CVar2;
  uVar7 = 0;
  pbVar4 = data->m_first;
  if ((CVar2 & Generic) != Default) {
    bVar1 = *pbVar4;
    uVar7 = (uint32_t)bVar1;
    uVar5 = 1;
    if ((char)bVar1 < '\0') {
      uVar5 = (uint)bVar1;
      if ((uVar7 & 0xffffffc0) == 0x80) {
        pbVar3 = pbVar4 + 1;
        uVar6 = (uVar5 & 0x3f) << 8;
        uVar5 = 2;
      }
      else {
        if ((uVar5 & 0xffffffe0) != 0xc0) {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"Invalid compressed integer in blob","");
          impl::throw_invalid(&local_58);
        }
        pbVar3 = pbVar4 + 3;
        uVar6 = (uint)pbVar4[2] << 8 | (uint)pbVar4[1] << 0x10 | (uVar5 & 0x1f) << 0x18;
        uVar5 = 4;
      }
      uVar7 = *pbVar3 | uVar6;
    }
    byte_view::check_available(data,uVar5);
    pbVar4 = data->m_first + uVar5;
    data->m_first = pbVar4;
  }
  this->m_generic_param_count = uVar7;
  bVar1 = *pbVar4;
  uVar7 = (uint32_t)bVar1;
  uVar5 = 1;
  if ((char)bVar1 < '\0') {
    uVar5 = (uint)bVar1;
    if ((uVar7 & 0xffffffc0) == 0x80) {
      pbVar3 = pbVar4 + 1;
      uVar6 = (uVar5 & 0x3f) << 8;
      uVar5 = 2;
    }
    else {
      if ((uVar5 & 0xffffffe0) != 0xc0) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"Invalid compressed integer in blob","");
        impl::throw_invalid(&local_58);
      }
      pbVar3 = pbVar4 + 3;
      uVar6 = (uint)pbVar4[2] << 8 | (uint)pbVar4[1] << 0x10 | (uVar5 & 0x1f) << 0x18;
      uVar5 = 4;
    }
    uVar7 = *pbVar3 | uVar6;
  }
  byte_view::check_available(data,uVar5);
  data->m_first = data->m_first + uVar5;
  this->m_param_count = uVar7;
  RetTypeSig::RetTypeSig(&this->m_ret_type,table,data);
  (this->m_params).
  super__Vector_base<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_params).
  super__Vector_base<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_params).
  super__Vector_base<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->m_param_count <= (uint)(*(int *)&data->m_last - *(int *)&data->m_first)) {
    std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>::reserve
              (&this->m_params,(ulong)this->m_param_count);
    if (this->m_param_count != 0) {
      uVar5 = 0;
      do {
        std::vector<winmd::reader::ParamSig,std::allocator<winmd::reader::ParamSig>>::
        emplace_back<winmd::reader::table_base_const*&,winmd::reader::byte_view&>
                  ((vector<winmd::reader::ParamSig,std::allocator<winmd::reader::ParamSig>> *)
                   &this->m_params,&local_38,data);
        uVar5 = uVar5 + 1;
      } while (uVar5 < this->m_param_count);
    }
    return;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Invalid blob array size","");
  impl::throw_invalid(&local_58);
}

Assistant:

MethodDefSig(table_base const* table, byte_view& data)
            : m_calling_convention(uncompress_enum<CallingConvention>(data))
            , m_generic_param_count(enum_mask(m_calling_convention, CallingConvention::Generic) == CallingConvention::Generic ? uncompress_unsigned(data) : 0)
            , m_param_count(uncompress_unsigned(data))
            , m_ret_type(table, data)
        {
            if (m_param_count > data.size())
            {
                impl::throw_invalid("Invalid blob array size");
            }
            m_params.reserve(m_param_count);
            for (uint32_t count = 0; count < m_param_count; ++count)
            {
                m_params.emplace_back(table, data);
            }
        }